

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isBilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths,Vec2 *xBounds,
               Vec2 *yBounds,float cmpReference,float result,bool isFixedPointDepth)

{
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec2 *yBounds_local;
  Vec2 *xBounds_local;
  Vec4 *depths_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  if (prec->pcfBits < 1) {
    prec_local._7_1_ =
         isBilinearAnyCompareValid(compareMode,prec,depths,cmpReference,result,isFixedPointDepth);
  }
  else {
    prec_local._7_1_ =
         isBilinearPCFCompareValid
                   (compareMode,prec,depths,xBounds,yBounds,cmpReference,result,isFixedPointDepth);
  }
  return prec_local._7_1_;
}

Assistant:

static bool isBilinearCompareValid (const Sampler::CompareMode	compareMode,
									const TexComparePrecision&	prec,
									const Vec4&					depths,
									const Vec2&					xBounds,
									const Vec2&					yBounds,
									const float					cmpReference,
									const float					result,
									const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isBilinearPCFCompareValid(compareMode, prec, depths, xBounds, yBounds, cmpReference, result, isFixedPointDepth);
	else
		return isBilinearAnyCompareValid(compareMode, prec, depths, cmpReference, result, isFixedPointDepth);
}